

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O1

int LZWReadByte(gif_source_ptr sinfo)

{
  UINT8 UVar1;
  UINT8 *pUVar2;
  j_compress_ptr pjVar3;
  jpeg_error_mgr *pjVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  U_CHAR buf [256];
  U_CHAR aUStack_118 [264];
  
  pUVar2 = sinfo->sp;
  if (sinfo->symbol_stack < pUVar2) {
    sinfo->sp = pUVar2 + -1;
    uVar6 = (uint)pUVar2[-1];
  }
  else {
    uVar5 = GetCode(sinfo);
    uVar6 = sinfo->clear_code;
    if (uVar5 == uVar6) {
      sinfo->code_size = sinfo->input_code_size + 1;
      sinfo->limit_code = uVar6 * 2;
      sinfo->max_code = uVar6 + 2;
      sinfo->sp = sinfo->symbol_stack;
      do {
        uVar6 = GetCode(sinfo);
      } while (uVar6 == sinfo->clear_code);
      if (sinfo->clear_code < (int)uVar6) {
        pjVar3 = sinfo->cinfo;
        pjVar4 = pjVar3->err;
        pjVar4->msg_code = 0x400;
        (*pjVar4->emit_message)((j_common_ptr)pjVar3,-1);
        uVar6 = 0;
      }
      sinfo->oldcode = uVar6;
      sinfo->firstcode = uVar6;
    }
    else if (uVar5 == sinfo->end_code) {
      if (sinfo->out_of_blocks == 0) {
        do {
          iVar7 = GetDataBlock(sinfo,aUStack_118);
        } while (0 < iVar7);
        sinfo->out_of_blocks = 1;
      }
      pjVar3 = sinfo->cinfo;
      pjVar4 = pjVar3->err;
      pjVar4->msg_code = 0x402;
      (*pjVar4->emit_message)((j_common_ptr)pjVar3,-1);
      uVar6 = 0;
    }
    else {
      uVar6 = uVar5;
      if (sinfo->max_code <= (int)uVar5) {
        if (sinfo->max_code < (int)uVar5) {
          pjVar3 = sinfo->cinfo;
          pjVar4 = pjVar3->err;
          pjVar4->msg_code = 0x400;
          (*pjVar4->emit_message)((j_common_ptr)pjVar3,-1);
          uVar5 = 0;
        }
        pUVar2 = sinfo->sp;
        sinfo->sp = pUVar2 + 1;
        *pUVar2 = (UINT8)sinfo->firstcode;
        uVar6 = sinfo->oldcode;
      }
      if (sinfo->clear_code <= (int)uVar6) {
        do {
          pUVar2 = sinfo->sp;
          UVar1 = sinfo->symbol_tail[(int)uVar6];
          sinfo->sp = pUVar2 + 1;
          *pUVar2 = UVar1;
          uVar6 = (uint)sinfo->symbol_head[(int)uVar6];
        } while (sinfo->clear_code <= (int)uVar6);
      }
      sinfo->firstcode = uVar6;
      lVar8 = (long)sinfo->max_code;
      if (lVar8 < 0x1000) {
        sinfo->symbol_head[lVar8] = (UINT16)sinfo->oldcode;
        sinfo->symbol_tail[lVar8] = (UINT8)uVar6;
        iVar7 = sinfo->max_code + 1;
        sinfo->max_code = iVar7;
        if ((sinfo->limit_code <= iVar7) && (sinfo->code_size < 0xc)) {
          sinfo->code_size = sinfo->code_size + 1;
          sinfo->limit_code = sinfo->limit_code * 2;
        }
      }
      sinfo->oldcode = uVar5;
      uVar6 = sinfo->firstcode;
    }
  }
  return uVar6;
}

Assistant:

LOCAL(int)
LZWReadByte(gif_source_ptr sinfo)
/* Read an LZW-compressed byte */
{
  register int code;            /* current working code */
  int incode;                   /* saves actual input code */

  /* If any codes are stacked from a previously read symbol, return them */
  if (sinfo->sp > sinfo->symbol_stack)
    return (int)(*(--sinfo->sp));

  /* Time to read a new symbol */
  code = GetCode(sinfo);

  if (code == sinfo->clear_code) {
    /* Reinit state, swallow any extra Clear codes, and */
    /* return next code, which is expected to be a raw byte. */
    ReInitLZW(sinfo);
    do {
      code = GetCode(sinfo);
    } while (code == sinfo->clear_code);
    if (code > sinfo->clear_code) { /* make sure it is a raw byte */
      WARNMS(sinfo->cinfo, JWRN_GIF_BADDATA);
      code = 0;                 /* use something valid */
    }
    /* make firstcode, oldcode valid! */
    sinfo->firstcode = sinfo->oldcode = code;
    return code;
  }

  if (code == sinfo->end_code) {
    /* Skip the rest of the image, unless GetCode already read terminator */
    if (!sinfo->out_of_blocks) {
      SkipDataBlocks(sinfo);
      sinfo->out_of_blocks = TRUE;
    }
    /* Complain that there's not enough data */
    WARNMS(sinfo->cinfo, JWRN_GIF_ENDCODE);
    /* Pad data with 0's */
    return 0;                   /* fake something usable */
  }

  /* Got normal raw byte or LZW symbol */
  incode = code;                /* save for a moment */

  if (code >= sinfo->max_code) { /* special case for not-yet-defined symbol */
    /* code == max_code is OK; anything bigger is bad data */
    if (code > sinfo->max_code) {
      WARNMS(sinfo->cinfo, JWRN_GIF_BADDATA);
      incode = 0;               /* prevent creation of loops in symbol table */
    }
    /* this symbol will be defined as oldcode/firstcode */
    *(sinfo->sp++) = (UINT8)sinfo->firstcode;
    code = sinfo->oldcode;
  }

  /* If it's a symbol, expand it into the stack */
  while (code >= sinfo->clear_code) {
    *(sinfo->sp++) = sinfo->symbol_tail[code]; /* tail is a byte value */
    code = sinfo->symbol_head[code]; /* head is another LZW symbol */
  }
  /* At this point code just represents a raw byte */
  sinfo->firstcode = code;      /* save for possible future use */

  /* If there's room in table... */
  if ((code = sinfo->max_code) < LZW_TABLE_SIZE) {
    /* Define a new symbol = prev sym + head of this sym's expansion */
    sinfo->symbol_head[code] = (UINT16)sinfo->oldcode;
    sinfo->symbol_tail[code] = (UINT8)sinfo->firstcode;
    sinfo->max_code++;
    /* Is it time to increase code_size? */
    if (sinfo->max_code >= sinfo->limit_code &&
        sinfo->code_size < MAX_LZW_BITS) {
      sinfo->code_size++;
      sinfo->limit_code <<= 1;  /* keep equal to 2^code_size */
    }
  }

  sinfo->oldcode = incode;      /* save last input symbol for future use */
  return sinfo->firstcode;      /* return first byte of symbol's expansion */
}